

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

StringPair *
icu_63::StringPair::create(UnicodeString *displayName,UnicodeString *id,UErrorCode *status)

{
  UBool UVar1;
  StringPair *this;
  UnicodeString *p;
  StringPair *local_58;
  StringPair *sp;
  UErrorCode *status_local;
  UnicodeString *id_local;
  UnicodeString *displayName_local;
  
  p = id;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    this = (StringPair *)UMemory::operator_new((UMemory *)0x88,(size_t)p);
    local_58 = (StringPair *)0x0;
    if (this != (StringPair *)0x0) {
      StringPair(this,displayName,id);
      p = displayName;
      local_58 = this;
    }
    if ((local_58 != (StringPair *)0x0) && (UVar1 = isBogus(local_58), UVar1 == '\0')) {
      return local_58;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    if (local_58 != (StringPair *)0x0) {
      ~StringPair(local_58);
      UMemory::operator_delete((UMemory *)local_58,p);
    }
  }
  return (StringPair *)0x0;
}

Assistant:

StringPair* 
StringPair::create(const UnicodeString& displayName, 
                   const UnicodeString& id,
                   UErrorCode& status)
{
    if (U_SUCCESS(status)) {
        StringPair* sp = new StringPair(displayName, id);
        if (sp == NULL || sp->isBogus()) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete sp;
            return NULL;
        }
        return sp;
    }
    return NULL;
}